

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O3

cbtVector3 __thiscall
gjkepa2_impl::MinkowskiDiff::Support(MinkowskiDiff *this,cbtVector3 *d,U index)

{
  cbtScalar cVar1;
  cbtScalar cVar2;
  undefined1 auVar3 [16];
  code *UNRECOVERED_JUMPTABLE;
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  float fVar8;
  undefined1 auVar9 [16];
  cbtVector3 cVar10;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  if (index != 0) {
    UNRECOVERED_JUMPTABLE = (code *)this->Ls;
    if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
      UNRECOVERED_JUMPTABLE =
           *(code **)(UNRECOVERED_JUMPTABLE +
                     *(long *)((long)&(this->m_shapes[1]->super_cbtCollisionShape).
                                      _vptr_cbtCollisionShape + *(long *)&this->field_0x88) + -1);
    }
    fVar8 = d->m_floats[1];
    cVar1 = d->m_floats[0];
    cVar2 = d->m_floats[2];
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (this->m_toshape1).m_el[0].m_floats[1])),
                             ZEXT416((uint)cVar1),
                             ZEXT416((uint)(this->m_toshape1).m_el[0].m_floats[0]));
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (this->m_toshape1).m_el[1].m_floats[1])),
                             ZEXT416((uint)cVar1),
                             ZEXT416((uint)(this->m_toshape1).m_el[1].m_floats[0]));
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (this->m_toshape1).m_el[2].m_floats[1])),
                             ZEXT416((uint)cVar1),
                             ZEXT416((uint)(this->m_toshape1).m_el[2].m_floats[0]));
    auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)cVar2),
                             ZEXT416((uint)(this->m_toshape1).m_el[0].m_floats[2]));
    auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)cVar2),
                             ZEXT416((uint)(this->m_toshape1).m_el[1].m_floats[2]));
    auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)cVar2),
                             ZEXT416((uint)(this->m_toshape1).m_el[2].m_floats[2]));
    auVar9 = vinsertps_avx(auVar9,auVar3,0x10);
    vinsertps_avx(auVar9,auVar4,0x28);
    auVar9 = (*UNRECOVERED_JUMPTABLE)();
    auVar7._0_8_ = auVar9._8_8_;
    auVar5._0_8_ = auVar9._0_8_;
    auVar7._8_56_ = extraout_var_00;
    auVar5._8_56_ = extraout_var;
    auVar4 = auVar5._0_16_;
    auVar9 = vmovshdup_avx(auVar4);
    fVar8 = auVar9._0_4_;
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (this->m_toshape0).m_basis.m_el[0].m_floats[1]))
                             ,auVar4,ZEXT416((uint)(this->m_toshape0).m_basis.m_el[0].m_floats[0]));
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (this->m_toshape0).m_basis.m_el[1].m_floats[1]))
                             ,auVar4,ZEXT416((uint)(this->m_toshape0).m_basis.m_el[1].m_floats[0]));
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (this->m_toshape0).m_basis.m_el[2].m_floats[1]))
                             ,auVar4,ZEXT416((uint)(this->m_toshape0).m_basis.m_el[2].m_floats[0]));
    auVar6 = auVar7._0_16_;
    auVar9 = vfmadd231ss_fma(auVar9,auVar6,
                             ZEXT416((uint)(this->m_toshape0).m_basis.m_el[0].m_floats[2]));
    auVar3 = vfmadd231ss_fma(auVar3,auVar6,
                             ZEXT416((uint)(this->m_toshape0).m_basis.m_el[1].m_floats[2]));
    auVar4 = vfmadd231ss_fma(auVar4,auVar6,
                             ZEXT416((uint)(this->m_toshape0).m_basis.m_el[2].m_floats[2]));
    auVar9 = vinsertps_avx(ZEXT416((uint)(auVar9._0_4_ + (this->m_toshape0).m_origin.m_floats[0])),
                           ZEXT416((uint)(auVar3._0_4_ + (this->m_toshape0).m_origin.m_floats[1])),
                           0x10);
    cVar10.m_floats._0_8_ = auVar9._0_8_;
    cVar10.m_floats[2] = auVar4._0_4_ + (this->m_toshape0).m_origin.m_floats[2];
    cVar10.m_floats[3] = 0.0;
    return (cbtVector3)cVar10.m_floats;
  }
  UNRECOVERED_JUMPTABLE = (code *)this->Ls;
  if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
    UNRECOVERED_JUMPTABLE =
         *(code **)(UNRECOVERED_JUMPTABLE +
                   *(long *)((long)&(this->m_shapes[0]->super_cbtCollisionShape).
                                    _vptr_cbtCollisionShape + *(long *)&this->field_0x88) + -1);
  }
  cVar10.m_floats = (cbtScalar  [4])(*UNRECOVERED_JUMPTABLE)();
  return (cbtVector3)cVar10.m_floats;
}

Assistant:

cbtVector3 Support(const cbtVector3& d, U index) const
	{
		if (index)
			return (Support1(d));
		else
			return (Support0(d));
	}